

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void * cm_expat_XML_GetBuffer(XML_Parser parser,int len)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  pvVar3 = *(void **)((long)parser + 0x38);
  lVar8 = *(long *)((long)parser + 0x40);
  if (lVar8 - (long)pvVar3 < (long)len) {
    pvVar2 = *(void **)((long)parser + 0x10);
    lVar1 = *(long *)((long)parser + 0x30);
    iVar7 = (int)(lVar1 - (long)pvVar2);
    iVar4 = 0x400;
    if (iVar7 < 0x400) {
      iVar4 = iVar7;
    }
    iVar6 = len + (int)((long)pvVar3 - lVar1) + iVar4;
    if (lVar8 - (long)pvVar2 < (long)iVar6) {
      iVar4 = (int)lVar8 - (int)lVar1;
      if (iVar4 == 0) {
        iVar4 = 0x400;
      }
      do {
        iVar4 = iVar4 * 2;
      } while (iVar4 < iVar6);
      pvVar2 = (void *)(**(code **)((long)parser + 0x18))((long)iVar4);
      if (pvVar2 == (void *)0x0) {
        *(undefined4 *)((long)parser + 0x210) = 1;
        pvVar3 = (void *)0x0;
      }
      else {
        *(long *)((long)parser + 0x40) = (long)iVar4 + (long)pvVar2;
        lVar8 = *(long *)((long)parser + 0x30);
        if (lVar8 == 0) {
          pvVar3 = (void *)(*(long *)((long)parser + 0x38) + (long)pvVar2);
          pvVar5 = pvVar2;
        }
        else {
          iVar4 = (int)lVar8 - *(int *)((long)parser + 0x10);
          if (0x3ff < iVar4) {
            iVar4 = 0x400;
          }
          memcpy(pvVar2,(void *)(-iVar4 + lVar8),
                 (*(long *)((long)parser + 0x38) - lVar8) + (long)iVar4);
          (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x10));
          pvVar5 = (void *)((long)pvVar2 + (long)iVar4);
          pvVar3 = (void *)((*(long *)((long)parser + 0x38) - *(long *)((long)parser + 0x30)) +
                           (long)pvVar5);
        }
        *(void **)((long)parser + 0x38) = pvVar3;
        *(void **)((long)parser + 0x10) = pvVar2;
        *(void **)((long)parser + 0x30) = pvVar5;
      }
    }
    else if ((long)iVar4 < lVar1 - (long)pvVar2) {
      lVar8 = (long)(iVar7 - iVar4);
      memmove(pvVar2,(void *)((long)pvVar2 + lVar8),((long)pvVar3 - lVar1) + (long)iVar4);
      pvVar3 = (void *)(*(long *)((long)parser + 0x38) - lVar8);
      *(void **)((long)parser + 0x38) = pvVar3;
      *(long *)((long)parser + 0x30) = *(long *)((long)parser + 0x30) - lVar8;
    }
  }
  return pvVar3;
}

Assistant:

void *XML_GetBuffer(XML_Parser parser, int len)
{
  if (len > bufferLim - bufferEnd) {
    /* FIXME avoid integer overflow */
    int neededSize = len + (bufferEnd - bufferPtr);
#ifdef XML_CONTEXT_BYTES
    int keep = bufferPtr - buffer;

    if (keep > XML_CONTEXT_BYTES)
      keep = XML_CONTEXT_BYTES;
    neededSize += keep;
#endif  /* defined XML_CONTEXT_BYTES */
    if (neededSize  <= bufferLim - buffer) {
#ifdef XML_CONTEXT_BYTES
      if (keep < bufferPtr - buffer) {
        int offset = (bufferPtr - buffer) - keep;
        memmove(buffer, &buffer[offset], bufferEnd - bufferPtr + keep);
        bufferEnd -= offset;
        bufferPtr -= offset;
      }
#else
      memmove(buffer, bufferPtr, bufferEnd - bufferPtr);
      bufferEnd = buffer + (bufferEnd - bufferPtr);
      bufferPtr = buffer;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
    else {
      char *newBuf;
      int bufferSize = bufferLim - bufferPtr;
      if (bufferSize == 0)
        bufferSize = INIT_BUFFER_SIZE;
      do {
        bufferSize *= 2;
      } while (bufferSize < neededSize);
      newBuf = MALLOC(bufferSize);
      if (newBuf == 0) {
        errorCode = XML_ERROR_NO_MEMORY;
        return 0;
      }
      bufferLim = newBuf + bufferSize;
#ifdef XML_CONTEXT_BYTES
      if (bufferPtr) {
        int xmKeep = bufferPtr - buffer;
        if (xmKeep > XML_CONTEXT_BYTES)
          xmKeep = XML_CONTEXT_BYTES;
        memcpy(newBuf, &bufferPtr[-xmKeep], bufferEnd - bufferPtr + xmKeep);
        FREE(buffer);
        buffer = newBuf;
        bufferEnd = buffer + (bufferEnd - bufferPtr) + xmKeep;
        bufferPtr = buffer + xmKeep;
      }
      else {
        bufferEnd = newBuf + (bufferEnd - bufferPtr);
        bufferPtr = buffer = newBuf;
      }
#else
      if (bufferPtr) {
        memcpy(newBuf, bufferPtr, bufferEnd - bufferPtr);
        FREE(buffer);
      }
      bufferEnd = newBuf + (bufferEnd - bufferPtr);
      bufferPtr = buffer = newBuf;
#endif  /* not defined XML_CONTEXT_BYTES */
    }
  }
  return bufferEnd;
}